

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
fasthuf_decode(exr_const_context_t pctxt,FastHufDecoder *fhd,uint8_t *src,uint64_t numSrcBits,
              uint16_t *dst,uint64_t numDstElems)

{
  uint uVar1;
  ulong uVar2;
  long in_RCX;
  byte *in_RDX;
  int *in_RSI;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  uint32_t i;
  uint32_t rleCount;
  uint64_t id;
  int tableIdx;
  int codeLen;
  int symbol;
  uint8_t *currByte;
  uint32_t rleSym;
  int bufferBackNumBits;
  int bufferNumBits;
  uint64_t tMin;
  uint64_t dstIdx;
  uint64_t bufferBack;
  uint64_t buffer;
  uint local_90;
  uint local_78;
  int local_74;
  byte *local_70;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  long local_30;
  ulong local_28 [2];
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_70 = in_RDX + 0x10;
  local_28[0] = in_RCX - 0x80;
  local_40 = (ulong)*in_RDX << 0x38 | (ulong)in_RDX[1] << 0x30 | (ulong)in_RDX[2] << 0x28 |
             (ulong)in_RDX[3] << 0x20 | (ulong)in_RDX[4] << 0x18 | (ulong)in_RDX[5] << 0x10 |
             (ulong)in_RDX[6] << 8 | (ulong)in_RDX[7];
  local_5c = 0x40;
  local_48 = (ulong)in_RDX[8] << 0x38 | (ulong)in_RDX[9] << 0x30 | (ulong)in_RDX[10] << 0x28 |
             (ulong)in_RDX[0xb] << 0x20 | (ulong)in_RDX[0xc] << 0x18 | (ulong)in_RDX[0xd] << 0x10 |
             (ulong)in_RDX[0xe] << 8 | (ulong)in_RDX[0xf];
  local_60 = 0x40;
  local_50 = 0;
  local_58 = *(ulong *)(in_RSI + 0x114f2);
  local_64 = *in_RSI;
  local_38 = in_R9;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (local_38 <= local_50) {
      if (local_28[0] == 0) {
        local_4 = 0;
      }
      else {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))
                    (local_10,0x17,
                     "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                     ,local_28[0] & 0xffffffff);
        }
        local_4 = 0x17;
      }
      return local_4;
    }
    if (local_40 < local_58) {
      if (local_5c < 0x40) {
        FastHufDecoder_refill(&local_40,local_5c,&local_48,&local_60,&local_70,local_28);
        local_5c = 0x40;
      }
      local_78 = 0xd;
      while (local_40 < *(ulong *)(local_18 + (long)(int)local_78 * 2 + 0x10004)) {
        local_78 = local_78 + 1;
      }
      if ((int)(uint)*(byte *)((long)local_18 + 9) < (int)local_78) {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))
                    (local_10,0x17,"Huffman decode error (Decoded an invalid symbol)");
        }
        return 0x17;
      }
      uVar2 = *(long *)(local_18 + (long)(int)local_78 * 2 + 0x1007c) +
              (local_40 >> (0x40U - (char)local_78 & 0x3f));
      if ((uint)local_18[1] <= uVar2) {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))
                    (local_10,0x17,"Huffman decode error (Decoded an invalid symbol)");
        }
        return 0x17;
      }
      local_74 = local_18[uVar2 + 3];
    }
    else {
      uVar1 = (uint)(local_40 >> 0x34);
      local_78 = (uint)*(byte *)((long)local_18 + (long)(int)uVar1 + 0x443c8);
      local_74 = local_18[(long)(int)uVar1 + 0x100f2];
    }
    local_40 = local_40 << ((byte)local_78 & 0x3f);
    local_5c = local_5c - local_78;
    if (local_74 == local_64) {
      if (local_5c < 8) {
        FastHufDecoder_refill(&local_40,local_5c,&local_48,&local_60,&local_70,local_28);
        local_5c = 0x40;
      }
      uVar1 = (uint)(byte)(local_40 >> 0x38);
      if (local_50 == 0) {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))
                    (local_10,0x17,"Huffman decode error (RLE code with no previous symbol)");
        }
        return 0x17;
      }
      if (local_38 < local_50 + uVar1) {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))
                    (local_10,0x17,
                     "Huffman decode error (Symbol run beyond expected output buffer length)");
        }
        return 0x17;
      }
      if ((uVar1 == 0) || (0x7ffffffe < uVar1)) {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))(local_10,0x17,"Huffman decode error (Invalid RLE length)");
        }
        return 0x17;
      }
      for (local_90 = 0; local_90 < uVar1; local_90 = local_90 + 1) {
        *(undefined2 *)(local_30 + (local_50 + local_90) * 2) =
             *(undefined2 *)(local_30 + (local_50 - 1) * 2);
      }
      local_50 = uVar1 + local_50;
      local_40 = local_40 << 8;
      local_5c = local_5c + -8;
    }
    else {
      *(short *)(local_30 + local_50 * 2) = (short)local_74;
      local_50 = local_50 + 1;
    }
    if (local_5c < 0xc) {
      FastHufDecoder_refill(&local_40,local_5c,&local_48,&local_60,&local_70,local_28);
      local_5c = 0x40;
    }
  } while( true );
}

Assistant:

static exr_result_t
fasthuf_decode (
    exr_const_context_t         pctxt,
    FastHufDecoder* NO_ALIAS    fhd,
    const uint8_t* NO_ALIAS     src,
    uint64_t                    numSrcBits,
    uint16_t* NO_ALIAS          dst,
    uint64_t                    numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //
    uint64_t       buffer, bufferBack, dstIdx, tMin;
    int            bufferNumBits, bufferBackNumBits;
    uint32_t       rleSym;
    const uint8_t* currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    buffer        = READ64 (src);
    bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    bufferBack        = READ64 ((src + sizeof (uint64_t)));
    bufferBackNumBits = 64;
    dstIdx            = 0;

    tMin = fhd->_tableMin;
    rleSym = fhd->_rleSymbol;

    while (dstIdx < numDstElems)
    {
        int symbol, codeLen;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (tMin <= buffer)
        {
            int tableIdx = buffer >> INDEX_BIT_SHIFT;
            codeLen = fhd->_tableCodeLen[tableIdx];
            symbol  = fhd->_tableSymbol[tableIdx];
        }
        else
        {
            uint64_t id;

            if (bufferNumBits < 64)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);
                bufferNumBits = 64;
            }

            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            while (fhd->_ljBase[codeLen] >
                   buffer /* && codeLen <= _maxCodeLength */)
                codeLen++;

            if (codeLen > fhd->_maxCodeLength)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < (uint64_t) fhd->_numSymbols)
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == rleSym)
        {
            uint32_t rleCount;

            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (dstIdx + (uint64_t) rleCount > numDstElems)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (rleCount == 0 || rleCount >= (uint32_t)INT32_MAX)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (uint32_t i = 0; i < rleCount; ++i)
                dst[dstIdx + (uint64_t) i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = (uint16_t) symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            FastHufDecoder_refill (
                &buffer,
                bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                (int) numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}